

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O1

void cvode_emit_interface(void)

{
  Symbol *pSVar1;
  List *pLVar2;
  int iVar3;
  uint uVar4;
  undefined8 in_RAX;
  Item *pIVar5;
  List *pLVar6;
  int i;
  Item *pIVar7;
  Item *pIVar8;
  char *str;
  undefined4 uVar9;
  
  if (cvode_not_allowed != 0) {
    lappendstr(defs_list,"\nstatic int _ode_count(int);\n");
    sprintf(buf,
            "\nstatic int _ode_count(int _type){ hoc_execerror(\"%s\", \"cannot be used with CVODE\"); return 0;}\n"
            ,mechname);
    lappendstr(procfunc,buf);
    return;
  }
  if (cvode_emit != 0) {
    lappendstr(defs_list,
               "\nstatic int _ode_count(int);\nstatic void _ode_map(int, double**, double**, double*, Datum*, double*, int);\nstatic void _ode_spec(NrnThread*, Memb_list*, int);\nstatic void _ode_matsol(NrnThread*, Memb_list*, int);\n"
              );
    sprintf(buf,"\nstatic int _ode_count(int _type){ return %d;}\n",(ulong)(uint)cvode_neq_);
    lappendstr(procfunc,buf);
    sprintf(buf,"\n#define _cvode_ieq _ppvar[%d]._i\n",(ulong)(uint)cvode_ieq_index);
    lappendstr(defs_list,buf);
    if (cvode_fun_->subtype == 0x80) {
      cvode_proced_emit();
    }
    else {
      lappendstr(procfunc,"\nstatic void _ode_spec(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
      pLVar6 = procfunc;
      pIVar5 = lappendstr(procfunc,"  ThreadDatum* _thread;\n");
      vectorize_substitute(pIVar5,"  double* _p; Datum* _ppvar; ThreadDatum* _thread;\n");
      lappendstr(pLVar6,
                 "  Node* _nd; double _v; int _iml, _cntml_padded, _cntml_actual;\n  _cntml_actual = _ml->_nodecount;\n  _cntml_padded = _ml->_nodecount_padded;\n  _thread = _ml->_thread;\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n    _p = _ml->_data[_iml]; _ppvar = _ml->_pdata[_iml];\n    _nd = _ml->_nodelist[_iml];\n    v = NODEV(_nd);\n"
                );
      pLVar6 = get_ion_variables(1);
      if (pLVar6->next->itemtype != 0) {
        movelist(pLVar6->next,pLVar6->prev,procfunc);
      }
      sprintf(buf,"    _ode_spec%d",(ulong)(uint)cvode_num_);
      lappendstr(procfunc,buf);
      pIVar5 = lappendstr(procfunc,"();\n");
      vectorize_substitute(pIVar5,"(_threadargs_);\n");
      pLVar6 = set_ion_variables(1);
      if (pLVar6->next->itemtype != 0) {
        movelist(pLVar6->next,pLVar6->prev,procfunc);
      }
      lappendstr(procfunc,"}}\n");
      lappendstr(procfunc,
                 "\nstatic void _ode_map(int _ieq, double** _pv, double** _pvdot, double* _pp, Datum* _ppd, double* _atol, int _type) {"
                );
      pIVar5 = lappendstr(procfunc,"\n");
      vectorize_substitute(pIVar5,"\n\tdouble* _p; Datum* _ppvar;\n");
      sprintf(buf,
              "\tint _i; _p = _pp; _ppvar = _ppd;\n\t_cvode_ieq = _ieq;\n\tfor (_i=0; _i < %d; ++_i) {\n\t\t_pv[_i] = _pp + _slist%d[_i];  _pvdot[_i] = _pp + _dlist%d[_i];\n\t\t_cvode_abstol(_atollist, _atol, _i);\n\t}\n"
              ,(ulong)(uint)cvode_neq_,(ulong)(uint)cvode_num_,(ulong)(uint)cvode_num_);
      lappendstr(procfunc,buf);
      uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
      pLVar6 = useion->next;
      if (pLVar6 != useion) {
        do {
          pIVar5 = pLVar6->next->next;
          pIVar7 = ((pIVar5->element).itm)->next;
          if (pIVar7 != (pIVar5->element).itm) {
            do {
              pSVar1 = (pIVar7->element).sym;
              if ((pSVar1->nrntype & 0x1000) != 0) {
                if ((pSVar1->subtype & 0x10) == 0) {
                  if (ion_synonym == (List *)0x0) {
                    ion_synonym = newlist();
                  }
                  pLVar2 = procfunc;
                  pLVar6 = procfunc->next;
                  while( true ) {
                    if (pLVar6 == pLVar2) goto LAB_0010b3e8;
                    if ((((pLVar6->itemtype == 1) &&
                         (pSVar1 = (pLVar6->element).sym, pSVar1 == (Symbol *)(pIVar7->element).itm)
                         ) && (pIVar8 = pLVar6->next, pIVar8->itemtype == 1)) &&
                       (iVar3 = strcmp(((pIVar8->element).sym)->name,"="), iVar3 == 0)) break;
                    pLVar6 = pLVar6->next;
                  }
                  sprintf(buf,"_ion_%s = ",pSVar1->name);
                  lappendstr(ion_synonym,buf);
                  pIVar8 = pIVar8->next;
                  do {
                    if (pIVar8 == procfunc->prev) {
LAB_0010b3e8:
                      diag(((pIVar7->element).sym)->name,
                           " is WRITE but is not a STATE and has no assignment statement");
                    }
                    lappenditem(ion_synonym,pIVar8);
                    if ((pIVar8->itemtype == 1) && ((Symbol *)(pIVar8->element).itm == semi))
                    goto LAB_0010b405;
                    pIVar8 = pIVar8->next;
                  } while( true );
                }
                uVar4 = slist_search(cvode_num_,pSVar1);
                sprintf(buf,"\t_pv[%d] = &(_ion_%s);\n",(ulong)uVar4,((pIVar7->element).sym)->name);
                lappendstr(procfunc,buf);
              }
LAB_0010b405:
              pIVar7 = pIVar7->next;
            } while (pIVar7 != (pIVar5->element).itm);
          }
          uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
          pLVar6 = pIVar5->next->next;
        } while (pLVar6 != useion);
      }
      lappendstr(procfunc,"}\n");
      if (ion_synonym != (List *)0x0) {
        lappendstr(defs_list,"static void _ode_synonym(int, double**, Datum**);\n");
        lappendstr(procfunc,"static void _ode_synonym(int _cnt, double** _pp, Datum** _ppd) {");
        pIVar5 = lappendstr(procfunc,"\n");
        vectorize_substitute(pIVar5,"\n\tdouble* _p; Datum* _ppvar;\n");
        lappendstr(procfunc,
                   "\tint _i; \n\tfor (_i=0; _i < _cnt; ++_i) {_p = _pp[_i]; _ppvar = _ppd[_i];\n");
        movelist(ion_synonym->next,ion_synonym->prev,procfunc);
        lappendstr(procfunc,"}}\n");
      }
      lappendstr(procfunc,"\nstatic void _ode_matsol(NrnThread* _nt, Memb_list* _ml, int _type) {\n"
                );
      pLVar6 = procfunc;
      pIVar5 = lappendstr(procfunc,"  ThreadDatum* _thread;\n");
      vectorize_substitute(pIVar5,"  double* _p; Datum* _ppvar; ThreadDatum* _thread;\n");
      lappendstr(pLVar6,
                 "  Node* _nd; double _v; int _iml, _cntml_padded, _cntml_actual;\n  _cntml_actual = _ml->_nodecount;\n  _cntml_padded = _ml->_nodecount_padded;\n  _thread = _ml->_thread;\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n    _p = _ml->_data[_iml]; _ppvar = _ml->_pdata[_iml];\n    _nd = _ml->_nodelist[_iml];\n    v = NODEV(_nd);\n"
                );
      pLVar6 = get_ion_variables(1);
      if (pLVar6->next->itemtype != 0) {
        movelist(pLVar6->next,pLVar6->prev,procfunc);
      }
      iVar3 = cvode_num_;
      if (cvode_fun_->subtype == 0x400) {
        sprintf(buf,"_cvode_sparse(&_cvsparseobj%d, %d, _dlist%d, _p, _ode_matsol%d, &_coef%d);\n",
                (ulong)(uint)cvode_num_,(ulong)(uint)cvode_neq_,(ulong)(uint)cvode_num_,
                (ulong)(uint)cvode_num_,CONCAT44(uVar9,cvode_num_));
        lappendstr(procfunc,buf);
        sprintf(buf,
                "_cvode_sparse_thread(&_thread[_cvspth%d]._pvoid, %d, _dlist%d, _p, _ode_matsol%d, _ppvar, _thread, _nt);\n"
                ,(ulong)(uint)iVar3,(ulong)(uint)cvode_neq_,(ulong)(uint)iVar3,(ulong)(uint)iVar3);
        pIVar5 = procfunc->prev;
        str = buf;
      }
      else {
        sprintf(buf,"_ode_matsol%d",(ulong)(uint)cvode_num_);
        lappendstr(procfunc,buf);
        pIVar5 = lappendstr(procfunc,"();\n");
        str = "(_threadargs_);\n";
      }
      vectorize_substitute(pIVar5,str);
      lappendstr(procfunc,"}}\n");
    }
    if ((state_discon_list_ != (List *)0x0) &&
       (pIVar5 = state_discon_list_->next, pIVar5 != state_discon_list_)) {
      do {
        pIVar7 = (pIVar5->element).itm;
        if ((pIVar7->itemtype == 1) && ((((pIVar7->element).sym)->subtype & 0x10) != 0)) {
          uVar4 = slist_search(cvode_num_,(pIVar7->element).sym);
          sprintf(buf,"_cvode_ieq + %d, &",(ulong)uVar4);
          replacstr(pIVar7->prev,buf);
        }
        pIVar5 = pIVar5->next;
      } while (pIVar5 != state_discon_list_);
    }
  }
  return;
}

Assistant:

void cvode_emit_interface() {
	List* lst;
	Item* q, *q1;
	if (cvode_not_allowed) {
		Lappendstr(defs_list, "\n\
static int _ode_count(int);\n");
		sprintf(buf, "\n\
static int _ode_count(int _type){ hoc_execerror(\"%s\", \"cannot be used with CVODE\"); return 0;}\n",
			mechname);
		Lappendstr(procfunc, buf);
	}else if (cvode_emit) {

		Lappendstr(defs_list, "\n\
static int _ode_count(int);\n\
static void _ode_map(int, double**, double**, double*, Datum*, double*, int);\n\
static void _ode_spec(NrnThread*, Memb_list*, int);\n\
static void _ode_matsol(NrnThread*, Memb_list*, int);\n\
");
		sprintf(buf, "\n\
static int _ode_count(int _type){ return %d;}\n",
			cvode_neq_);
		Lappendstr(procfunc, buf);
		sprintf(buf, "\n#define _cvode_ieq _ppvar[%d]._i\n",cvode_ieq_index);
		Lappendstr(defs_list, buf);

   if (cvode_fun_->subtype == PROCED) {
	cvode_proced_emit();
   }else{
		Lappendstr(procfunc, "\nstatic void _ode_spec(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
		out_nt_ml_frag(procfunc);
		lst = get_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		sprintf(buf,"    _ode_spec%d", cvode_num_);
		Lappendstr(procfunc, buf);
		vectorize_substitute(lappendstr(procfunc, "();\n"), "(_threadargs_);\n");
		lst = set_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		Lappendstr(procfunc, "}}\n");

		Lappendstr(procfunc, "\n\
static void _ode_map(int _ieq, double** _pv, double** _pvdot, double* _pp, Datum* _ppd, double* _atol, int _type) {");
		vectorize_substitute(lappendstr(procfunc, "\n"), "\n\
	double* _p; Datum* _ppvar;\n");
		sprintf(buf, "\
	int _i; _p = _pp; _ppvar = _ppd;\n\
	_cvode_ieq = _ieq;\n\
	for (_i=0; _i < %d; ++_i) {\n\
		_pv[_i] = _pp + _slist%d[_i];  _pvdot[_i] = _pp + _dlist%d[_i];\n\
		_cvode_abstol(_atollist, _atol, _i);\n\
	}\n",
			cvode_neq_, cvode_num_, cvode_num_);
		Lappendstr(procfunc, buf);
/* need to take care of case where a state is an ion concentration. Replace
the _pp pointer with a pointer to the actual ion model's concentration */
		cvode_conc_map();
		Lappendstr(procfunc, "}\n"); 
		if (ion_synonym) {
			Lappendstr(defs_list, "static void _ode_synonym(int, double**, Datum**);\n");
			Lappendstr(procfunc, "\
static void _ode_synonym(int _cnt, double** _pp, Datum** _ppd) {");
		vectorize_substitute(lappendstr(procfunc, "\n"), "\n\
	double* _p; Datum* _ppvar;\n");
			Lappendstr(procfunc, "\
	int _i; \n\
	for (_i=0; _i < _cnt; ++_i) {_p = _pp[_i]; _ppvar = _ppd[_i];\n");
			movelist(ion_synonym->next, ion_synonym->prev, procfunc);
			Lappendstr(procfunc, "}}\n");
		}

		Lappendstr(procfunc, "\nstatic void _ode_matsol(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
		out_nt_ml_frag(procfunc);
		lst = get_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		if (cvode_fun_->subtype == KINF) {
			int i = cvode_num_;
sprintf(buf, "_cvode_sparse(&_cvsparseobj%d, %d, _dlist%d, _p, _ode_matsol%d, &_coef%d);\n",
				i, cvode_neq_, i, i, i);
			Lappendstr(procfunc, buf);
sprintf(buf, "_cvode_sparse_thread(&_thread[_cvspth%d]._pvoid, %d, _dlist%d, _p, _ode_matsol%d, _ppvar, _thread, _nt);\n",
				i, cvode_neq_, i, i);
			vectorize_substitute(procfunc->prev, buf);
			
		}else{
			sprintf(buf, "_ode_matsol%d", cvode_num_);
			Lappendstr(procfunc, buf);
			vectorize_substitute(lappendstr(procfunc, "();\n"), "(_threadargs_);\n");
		}
		Lappendstr(procfunc, "}}\n");
	}
	/* handle the state_discontinuities */
	if (state_discon_list_) ITERATE(q, state_discon_list_) {
		Symbol* s;
		int sindex;
		q1 = ITM(q);
		s = SYM(q1);
		if (q1->itemtype == SYMBOL && (s->subtype & STAT)) {
			sindex = slist_search(cvode_num_, s);
			sprintf(buf, "_cvode_ieq + %d, &", sindex);
			replacstr(q1->prev, buf);
		}
	}
   }
}